

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  undefined8 in_RCX;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_128;
  long *local_120 [2];
  long local_110 [2];
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string s1;
  string line;
  undefined1 local_a0 [8];
  string s2;
  int local_78;
  size_type *local_60;
  string name;
  int local_38;
  byte local_31;
  int count;
  
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&s1._M_string_length;
  s1._M_dataplus._M_p = (pointer)0x0;
  s1._M_string_length._0_1_ = 0;
  local_a0 = (undefined1  [8])&s2._M_string_length;
  s2._M_dataplus._M_p = (pointer)0x0;
  s2._M_string_length._0_1_ = 0;
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,
             (string *)
             &parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,cVar1);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)local_a0,cVar1);
  std::istream::operator>>((istream *)&std::cin,&local_38);
  std::istream::ignore();
  dVar10 = get_number((string *)
                      &parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  dVar11 = get_number((string *)local_a0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,
                      (char *)parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)s1._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  dVar10 = (dVar10 * 3.141592653589793) / 180.0;
  poVar3 = std::ostream::_M_insert<double>(dVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_a0,(long)s2._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  dVar11 = (dVar11 * 3.141592653589793) / 180.0;
  poVar3 = std::ostream::_M_insert<double>(dVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  plVar4 = (long *)std::ostream::operator<<(poVar3,local_38);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  local_60 = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  bVar6 = 0 < local_38;
  if (local_38 < 1) {
    local_78 = 0;
  }
  else {
    local_78 = 0;
    iVar2 = 0;
    do {
      s1.field_2._8_8_ = &line._M_string_length;
      line._M_dataplus._M_p = (pointer)0x0;
      line._M_string_length._0_1_ = 0;
      line.field_2._12_4_ = iVar2;
      cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)(s1.field_2._M_local_buf + 8),cVar1);
      local_31 = bVar6;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_100,6,(allocator_type *)local_120);
      lVar7 = 0;
      uVar8 = 0;
      s2.field_2._8_8_ = 0;
      do {
        lVar5 = std::__cxx11::string::find((char)(&s1.field_2._M_allocated_capacity + 1),0x3b);
        if (lVar5 == -1) {
          local_78 = -1;
        }
        else {
          std::__cxx11::string::substr
                    ((ulong)local_120,(ulong)(&s1.field_2._M_allocated_capacity + 1));
          std::__cxx11::string::operator=
                    ((string *)((long)&((_Alloc_hider *)local_100)->_M_p + lVar7),
                     (string *)local_120);
          if (local_120[0] != local_110) {
            operator_delete(local_120[0],local_110[0] + 1);
          }
          in_RCX = 0xffffffffffffffff;
          std::__cxx11::string::substr((ulong)local_120,(ulong)(s1.field_2._M_local_buf + 8));
          std::__cxx11::string::operator=
                    ((string *)(s1.field_2._M_local_buf + 8),(string *)local_120);
          if (local_120[0] != local_110) {
            operator_delete(local_120[0],local_110[0] + 1);
          }
        }
        if (lVar5 == -1) break;
        bVar9 = 3 < uVar8;
        uVar8 = uVar8 + 1;
        in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),bVar9);
        lVar7 = lVar7 + 0x20;
        s2.field_2._8_8_ = in_RCX;
      } while (uVar8 != 5);
      if ((s2.field_2._8_8_ & 1) != 0) {
        std::__cxx11::string::_M_assign((string *)((long)local_100 + 0xa0));
        name.field_2._8_8_ = get_number((string *)((long)local_100 + 0x80));
        dVar12 = get_number((string *)((long)local_100 + 0xa0));
        dVar13 = (dVar12 * 3.141592653589793) / 180.0;
        name.field_2._8_8_ = ((double)name.field_2._8_8_ * 3.141592653589793) / 180.0 - dVar10;
        dVar12 = cos((dVar10 + dVar13) * 0.5);
        dVar13 = dVar13 - dVar11;
        dVar12 = dVar12 * (double)name.field_2._8_8_ * dVar12 * (double)name.field_2._8_8_ +
                 dVar13 * dVar13;
        if (dVar12 < 0.0) {
          dVar12 = sqrt(dVar12);
        }
        else {
          dVar12 = SQRT(dVar12);
        }
        if ((name._M_dataplus._M_p == (pointer)0x0) || (dVar12 * 6371.0 < local_128)) {
          name.field_2._8_8_ = dVar12 * 6371.0;
          std::__cxx11::string::_M_assign((string *)&local_60);
          local_128 = (double)name.field_2._8_8_;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      if ((size_type *)s1.field_2._8_8_ != &line._M_string_length) {
        operator_delete((void *)s1.field_2._8_8_,
                        CONCAT71(line._M_string_length._1_7_,(undefined1)line._M_string_length) + 1)
        ;
      }
      bVar6 = local_31;
      if ((s2.field_2._8_8_ & 1) == 0) break;
      iVar2 = line.field_2._12_4_ + 1;
      bVar6 = iVar2 < local_38;
    } while (iVar2 < local_38);
  }
  if ((bVar6 & 1) == 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_60,(long)name._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    local_78 = 0;
    std::ostream::flush();
  }
  if (local_60 != &name._M_string_length) {
    operator_delete(local_60,CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length)
                             + 1);
  }
  if (local_a0 != (undefined1  [8])&s2._M_string_length) {
    operator_delete((void *)local_a0,
                    CONCAT71(s2._M_string_length._1_7_,(undefined1)s2._M_string_length) + 1);
  }
  if (parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&s1._M_string_length) {
    operator_delete(parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    CONCAT71(s1._M_string_length._1_7_,(undefined1)s1._M_string_length) + 1);
  }
  return local_78;
}

Assistant:

int main()
{
        int count;
        std::string s1, s2;
        double longtitude, latitude;
        getline(cin, s1);
        getline(cin, s2);
        cin >> count;
        cin.ignore();

        longtitude = get_number(s1)*M_PI/180;
        latitude = get_number(s2)*M_PI/180;
        std::cerr << s1 << ": " << longtitude << ", " << s2 << ": " << latitude << ", " << count << std::endl;

        std::string name;
        double min_distance;
        for (int i = 0; i < count; i++)
        {
                std::string line;
                getline(cin, line);

                std::vector<std::string> parts(6);
                for (int i = 0; i < 6 - 1; i++)
                {
                    std::string::size_type pos = line.find(';');
                    if (pos == std::string::npos)
                    {
                        //std::cout << "Invalid format: " << line << std::endl;
                        return -1;
                    }
                    parts[i] = line.substr(0, pos);
                    line = line.substr(pos + 1);
                    //std::cerr << "Part #" << i << ": " << parts[i] << std::endl;
                }
                parts[5] = line;
                //std::cerr << "Part #5: " << parts[5] << std::endl;

                double _long = get_number(parts[4])*M_PI/180;
                double _lat = get_number(parts[5])*M_PI/180;
                double x = (_long - longtitude)*cos((_lat + longtitude)/2);
                double y = _lat - latitude;
                double distance = sqrt(x*x + y*y)*6371;

                if (name.empty()
                    || min_distance > distance)
                {
                    name = parts[1];
                    min_distance = distance;
                }
        }

        std::cout << name << std::endl;

        return 0;
}